

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

void Imf_2_5::offsetInLineBufferTable
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine,int scanline1,
               int scanline2,int linesInLineBuffer,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *offsetInLineBuffer)

{
  reference pvVar1;
  const_reference pvVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_R8;
  int i;
  size_t offset;
  undefined4 local_2c;
  size_type in_stack_ffffffffffffffd8;
  value_type vVar3;
  value_type vVar4;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (in_R8,in_stack_ffffffffffffffd8);
  vVar3 = 0;
  for (local_2c = in_ESI; local_2c <= in_EDX; local_2c = local_2c + 1) {
    if (local_2c % in_ECX == 0) {
      vVar3 = 0;
    }
    vVar4 = vVar3;
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_R8,(long)local_2c);
    *pvVar1 = vVar3;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RDI,(long)local_2c);
    vVar3 = *pvVar2 + vVar4;
  }
  return;
}

Assistant:

void
offsetInLineBufferTable (const vector<size_t> &bytesPerLine,
                         int scanline1, int scanline2,
                         int linesInLineBuffer,
                         vector<size_t> &offsetInLineBuffer)
{
    offsetInLineBuffer.resize (bytesPerLine.size());

    size_t offset = 0;

    for (int i = scanline1; i <= scanline2; ++i)
    {
        if (i % linesInLineBuffer == 0)
            offset = 0;

        offsetInLineBuffer[i] = offset;
        offset += bytesPerLine[i];
    }
}